

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O1

void __thiscall DGameplayMenu::Drawer(DGameplayMenu *this)

{
  int iVar1;
  EColorRange normalcolor;
  FFont *font;
  DFrameBuffer *this_00;
  int iVar2;
  char text [64];
  
  DOptionMenu::Drawer(&this->super_DOptionMenu);
  mysnprintf(text,0x40,"dmflags = %d   dmflags2 = %d",(ulong)(uint)dmflags.Value);
  this_00 = screen;
  font = SmallFont;
  normalcolor = OptionSettings.mFontColorValue;
  iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
  iVar2 = FFont::StringWidth(SmallFont,(BYTE *)text);
  DCanvas::DrawText((DCanvas *)this_00,font,normalcolor,(iVar1 - iVar2 * CleanXfac_1) / 2,0,text,
                    0x40001394,1,0);
  return;
}

Assistant:

void Drawer ()
	{
		Super::Drawer();

		char text[64];
		mysnprintf(text, 64, "dmflags = %d   dmflags2 = %d", *dmflags, *dmflags2);
		screen->DrawText (SmallFont, OptionSettings.mFontColorValue,
			(screen->GetWidth() - SmallFont->StringWidth (text) * CleanXfac_1) / 2, 0, text,
			DTA_CleanNoMove_1, true, TAG_DONE);
	}